

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::openBeamlet_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,int aperture)

{
  size_t *psVar1;
  int *piVar2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  pair<int,_int> pVar6;
  _List_node_base *p_Var7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  bVar5 = isActiveBeamlet(this,beam);
  if ((bVar5) && (bVar5 = isOpenBeamlet(this,beam,aperture), !bVar5)) {
    pVar6 = Collimator::indexToPos(this->collimator,beam,this->angle);
    lVar13 = (long)pVar6.first;
    lVar8 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    uVar4 = *(undefined8 *)(lVar8 + lVar13 * 8);
    (this->last_mem).first.first = aperture;
    (this->last_mem).first.second = pVar6.first;
    (this->last_mem).second.first = (int)uVar4;
    (this->last_mem).second.second = (int)((ulong)uVar4 >> 0x20);
    iVar12 = *(int *)(lVar8 + lVar13 * 8);
    iVar10 = pVar6.second;
    if (iVar12 < 0) {
      p_Var3 = (_List_node_base *)
               (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[aperture];
      p_Var7 = (_List_node_base *)operator_new(0x20);
      *(int *)&p_Var7[1]._M_next = beam;
      p_Var7[1]._M_prev = p_Var3;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      piVar2 = (int *)(*(long *)&(this->A).
                                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[aperture].
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar13 * 8);
      piVar9 = piVar2 + 1;
      *piVar2 = iVar10;
    }
    else {
      lVar8 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      if (iVar10 < iVar12) {
        if (iVar10 < *(int *)(lVar8 + lVar13 * 8)) {
          iVar12 = 0;
          do {
            p_Var3 = (_List_node_base *)
                     (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[aperture];
            p_Var7 = (_List_node_base *)operator_new(0x20);
            *(int *)&p_Var7[1]._M_next = beam + iVar12;
            p_Var7[1]._M_prev = p_Var3;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(__return_storage_ptr__->
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            iVar12 = iVar12 + 1;
            lVar8 = *(long *)&(this->A).
                              super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[aperture].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data;
          } while (iVar12 < *(int *)(lVar8 + lVar13 * 8) - iVar10);
        }
        piVar9 = (int *)(lVar8 + lVar13 * 8);
      }
      else {
        iVar12 = *(int *)(lVar8 + 4 + lVar13 * 8);
        if (iVar12 < iVar10) {
          iVar11 = 0;
          do {
            p_Var3 = (_List_node_base *)
                     (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[aperture];
            p_Var7 = (_List_node_base *)operator_new(0x20);
            *(int *)&p_Var7[1]._M_next = iVar12 + (beam - iVar10) + 1 + iVar11;
            p_Var7[1]._M_prev = p_Var3;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(__return_storage_ptr__->
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            iVar11 = iVar11 + 1;
            lVar8 = *(long *)&(this->A).
                              super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[aperture].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data;
            iVar12 = *(int *)(lVar8 + 4 + lVar13 * 8);
          } while (iVar11 < iVar10 - iVar12);
        }
        piVar9 = (int *)(lVar8 + lVar13 * 8 + 4);
      }
    }
    *piVar9 = iVar10;
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              (&local_48,__return_storage_ptr__);
    updateIntensity(this,&local_48);
    while (local_48.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
      p_Var3 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &(local_48.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_48.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
      local_48.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = p_Var3;
    }
  }
  if (&this->last_diff != __return_storage_ptr__) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node.super__List_node_base._M_next,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair<int,double> > Station::openBeamlet(int beam, int aperture) {
   // cout << "Attempt to open beam: " << beam << endl;
    list<pair<int, double>> diff;
    //cout << "active: " << isActiveBeamlet(beam) << " open: " << isOpenBeamlet(beam, aperture) << " aperture: " << aperture << endl;
    if (isActiveBeamlet(beam) && !isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
      if (A[aperture][row].first < 0) {
        //When the row is completely closed
        diff.push_back(make_pair(beam, intensity[aperture]));
        A[aperture][row].first=coord.second;
        A[aperture][row].second=coord.second;
      } else {
        if (A[aperture][row].first > coord.second) {
          for (int i=0;i<(A[aperture][row].first-coord.second);i++)
            diff.push_back(make_pair(beam+i, intensity[aperture]));
          A[aperture][row].first = coord.second;
        } else {
          for (int i=0;i<(coord.second-A[aperture][row].second);i++)
            diff.push_back(make_pair(beam-(coord.second-A[aperture][row].second)+1+i, intensity[aperture]));
          A[aperture][row].second = coord.second;
        }
      }
		 	updateIntensity(diff);
		 //	printIntensity(true);
		}/* else {
		  cout << "Not active or not closed" << endl;
		} */
		last_diff=diff;
		return(diff);
  }